

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O1

Vec_Int_t * Acec_InsertTree(Gia_Man_t *pNew,Vec_Wec_t *vLeafMap)

{
  int *piVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *p_00;
  long lVar7;
  int Out [2];
  int In [3];
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  Gia_Man_t *local_38;
  
  iVar5 = vLeafMap->nSize;
  local_38 = pNew;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 + 4U) {
    iVar4 = iVar5 + 5;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  if (0 < vLeafMap->nSize) {
    lVar7 = 0;
    do {
      pVVar3 = vLeafMap->pArray;
      iVar5 = 0;
      if (pVVar3[lVar7].nSize != 0) {
        p_00 = pVVar3 + lVar7;
        iVar5 = p_00->nSize;
        if (1 < iVar5) {
          piVar2 = &p_00->nSize;
          local_40 = (lVar7 + 1) * 0x10;
          do {
            if (iVar5 == 2) {
              Vec_IntPush(p_00,0);
            }
            iVar5 = *piVar2;
            if (iVar5 < 1) {
LAB_00676e93:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar1 = p_00->pArray;
            local_4c = *piVar1;
            *piVar2 = iVar5 + -1;
            if (iVar5 != 1) {
              lVar6 = 0;
              do {
                piVar1[lVar6] = piVar1[lVar6 + 1];
                lVar6 = lVar6 + 1;
              } while (lVar6 < *piVar2);
            }
            iVar5 = *piVar2;
            if (iVar5 < 1) goto LAB_00676e93;
            local_48 = *piVar1;
            *piVar2 = iVar5 + -1;
            if (iVar5 != 1) {
              lVar6 = 0;
              do {
                piVar1[lVar6] = piVar1[lVar6 + 1];
                lVar6 = lVar6 + 1;
              } while (lVar6 < *piVar2);
            }
            iVar5 = *piVar2;
            if (iVar5 < 1) goto LAB_00676e93;
            local_44 = *piVar1;
            *piVar2 = iVar5 + -1;
            if (iVar5 != 1) {
              lVar6 = 0;
              do {
                piVar1[lVar6] = piVar1[lVar6 + 1];
                lVar6 = lVar6 + 1;
              } while (lVar6 < *piVar2);
            }
            Acec_InsertFadd(local_38,&local_4c,&local_54);
            Vec_IntPush(p_00,local_54);
            if (lVar7 + 1 < (long)vLeafMap->nSize) {
              pVVar3 = (Vec_Int_t *)((long)&vLeafMap->pArray->nCap + local_40);
            }
            else {
              pVVar3 = Vec_WecPushLevel(vLeafMap);
            }
            Vec_IntPush(pVVar3,local_50);
            if (vLeafMap->nSize <= lVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            pVVar3 = vLeafMap->pArray;
            p_00 = pVVar3 + lVar7;
            piVar2 = &pVVar3[lVar7].nSize;
            iVar5 = *piVar2;
          } while (1 < iVar5);
        }
        if (iVar5 != 1) {
          __assert_fail("Vec_IntSize(vLevel) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                        ,0x65,"Vec_Int_t *Acec_InsertTree(Gia_Man_t *, Vec_Wec_t *)");
        }
        iVar5 = *pVVar3[lVar7].pArray;
      }
      Vec_IntPush(p,iVar5);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vLeafMap->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Acec_InsertTree( Gia_Man_t * pNew, Vec_Wec_t * vLeafMap )
{
    Vec_Int_t * vRootRanks = Vec_IntAlloc( Vec_WecSize(vLeafMap) + 5 );
    Vec_Int_t * vLevel;
    int i, In[3], Out[2];
    Vec_WecForEachLevel( vLeafMap, vLevel, i )
    {
        if ( Vec_IntSize(vLevel) == 0 )
        {
            Vec_IntPush( vRootRanks, 0 );
            continue;
        }
        while ( Vec_IntSize(vLevel) > 1 )
        {
            if ( Vec_IntSize(vLevel) == 2 )
                Vec_IntPush( vLevel, 0 );
            //In[2] = Vec_IntPop( vLevel );
            //In[1] = Vec_IntPop( vLevel );
            //In[0] = Vec_IntPop( vLevel );

            In[0] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            In[1] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            In[2] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            Acec_InsertFadd( pNew, In, Out );
            Vec_IntPush( vLevel, Out[0] );
            if ( i+1 < Vec_WecSize(vLeafMap) )
                vLevel = Vec_WecEntry(vLeafMap, i+1);
            else
                vLevel = Vec_WecPushLevel(vLeafMap);
            Vec_IntPush( vLevel, Out[1] );
            vLevel = Vec_WecEntry(vLeafMap, i);
        }
        assert( Vec_IntSize(vLevel) == 1 );
        Vec_IntPush( vRootRanks, Vec_IntEntry(vLevel, 0) );
    }
    return vRootRanks;
}